

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dyndep_parser_test.cc
# Opt level: O0

void __thiscall
DyndepParserTestOutNoStatement::~DyndepParserTestOutNoStatement
          (DyndepParserTestOutNoStatement *this)

{
  DyndepParserTestOutNoStatement *this_local;
  
  DyndepParserTest::~DyndepParserTest(&this->super_DyndepParserTest);
  return;
}

Assistant:

TEST_F(DyndepParserTest, OutNoStatement) {
  const char kInput[] =
"ninja_dyndep_version = 1\n"
"build missing: dyndep\n";
  DyndepParser parser(&state_, &fs_, &dyndep_file_);
  string err;
  EXPECT_FALSE(parser.ParseTest(kInput, &err));
  EXPECT_EQ("input:2: no build statement exists for 'missing'\n"
            "build missing: dyndep\n"
            "             ^ near here", err);
}